

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob~.c
# Opt level: O1

void calc_derivatives(double *dstate,double *state,t_params *params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = params->p_saturation;
  dVar2 = 1.0;
  dVar3 = 1.0 / dVar1;
  dVar4 = *state * dVar3;
  dVar5 = 1.0;
  if (dVar4 <= 1.0) {
    dVar5 = -1.0;
    if (-1.0 <= dVar4) {
      dVar5 = dVar4;
    }
    dVar5 = (double)(float)dVar5;
  }
  dVar4 = state[1] * dVar3;
  dVar6 = 1.0;
  if (dVar4 <= 1.0) {
    dVar6 = -1.0;
    if (-1.0 <= dVar4) {
      dVar6 = dVar4;
    }
    dVar6 = (double)(float)dVar6;
  }
  dVar4 = state[2] * dVar3;
  dVar7 = 1.0;
  if (dVar4 <= 1.0) {
    dVar7 = -1.0;
    if (-1.0 <= dVar4) {
      dVar7 = dVar4;
    }
    dVar7 = (double)(float)dVar7;
  }
  dVar4 = params->p_cutoff * 6.283180236816406;
  dVar5 = (dVar5 * -0.3333333333333333 * dVar5 * dVar5 + dVar5) * dVar1;
  dVar6 = (dVar6 * -0.3333333333333333 * dVar6 * dVar6 + dVar6) * dVar1;
  dVar7 = (dVar7 * -0.3333333333333333 * dVar7 * dVar7 + dVar7) * dVar1;
  dVar8 = (params->p_input - params->p_resonance * state[3]) * dVar3;
  dVar9 = 1.0;
  if (dVar8 <= 1.0) {
    dVar9 = -1.0;
    if (-1.0 <= dVar8) {
      dVar9 = dVar8;
    }
    dVar9 = (double)(float)dVar9;
  }
  *dstate = ((dVar9 * -0.3333333333333333 * dVar9 * dVar9 + dVar9) * dVar1 - dVar5) * dVar4;
  dstate[1] = (dVar5 - dVar6) * dVar4;
  dstate[2] = (dVar6 - dVar7) * dVar4;
  dVar3 = dVar3 * state[3];
  if (dVar3 <= 1.0) {
    dVar2 = -1.0;
    if (-1.0 <= dVar3) {
      dVar2 = dVar3;
    }
    dVar2 = (double)(float)dVar2;
  }
  dstate[3] = dVar4 * (dVar7 - dVar1 * (dVar2 * -0.3333333333333333 * dVar2 * dVar2 + dVar2));
  return;
}

Assistant:

static void calc_derivatives(FLOAT *dstate, FLOAT *state, t_params *params)
{
    FLOAT k = ((float)(2*3.14159)) * params->p_cutoff;
    FLOAT sat = params->p_saturation, satinv = 1./sat;
    FLOAT satstate0 = clip(state[0], sat, satinv);
    FLOAT satstate1 = clip(state[1], sat, satinv);
    FLOAT satstate2 = clip(state[2], sat, satinv);
    dstate[0] = k *
        (clip(params->p_input - params->p_resonance * state[3], sat, satinv)
            - satstate0);
    dstate[1] = k * (satstate0 - satstate1);
    dstate[2] = k * (satstate1 - satstate2);
    dstate[3] = k * (satstate2 - clip(state[3], sat, satinv));
}